

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O3

void __thiscall
DIS::ElectromagneticEmissionsPdu::unmarshal
          (ElectromagneticEmissionsPdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  ulong uVar4;
  ElectromagneticEmissionSystemData x;
  ElectromagneticEmissionSystemData local_80;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::unmarshal(&this->_eventID,dataStream);
  DataStream::operator>>(dataStream,&this->_stateUpdateIndicator);
  c = &this->_numberOfSystems;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_paddingForEmissionsPdu);
  pEVar1 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**pEVar3->_vptr_ElectromagneticEmissionSystemData)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->_systems).
    super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  if (*c != '\0') {
    uVar4 = 0;
    do {
      ElectromagneticEmissionSystemData::ElectromagneticEmissionSystemData(&local_80);
      ElectromagneticEmissionSystemData::unmarshal(&local_80,dataStream);
      std::
      vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
      ::push_back(&this->_systems,&local_80);
      ElectromagneticEmissionSystemData::~ElectromagneticEmissionSystemData(&local_80);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *c);
  }
  return;
}

Assistant:

void ElectromagneticEmissionsPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _emittingEntityID.unmarshal(dataStream);
    _eventID.unmarshal(dataStream);
    dataStream >> _stateUpdateIndicator;
    dataStream >> _numberOfSystems;
    dataStream >> _paddingForEmissionsPdu;

    _systems.clear();
    for(size_t idx = 0; idx < _numberOfSystems; idx++)
    {
        ElectromagneticEmissionSystemData x;
        x.unmarshal(dataStream);
        _systems.push_back(x);
    }
}